

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O2

int __thiscall musicBlock::findFreeChannel(musicBlock *this,uint flag,uint channel,uchar note)

{
  uint slot;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  channelEntry *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  pcVar4 = this->channels;
  uVar3 = 0;
  uVar1 = 0;
  for (uVar5 = 0; slot = (uint)uVar1, this->io->OPLchannels != uVar5; uVar5 = uVar5 + 1) {
    uVar2 = 0;
    if (pcVar4->note == note) {
      uVar2 = (uint)(pcVar4->channel == channel) << 0x1e;
    }
    uVar6 = (ulong)((int)this->MLtime - (int)pcVar4->time & 0x1fffffffU |
                   (pcVar4->flags & 2) << 0x1c) |
            (long)(int)((pcVar4->flags & 0xffffff80) << 0x18 | uVar2);
    if (uVar3 < uVar6) {
      uVar1 = uVar5 & 0xffffffff;
      uVar3 = uVar6;
    }
    pcVar4 = pcVar4 + 1;
  }
  if (((flag & 1) == 0) || ((uVar3 & 0x80000000) != 0)) {
    releaseChannel(this,slot,1);
  }
  else {
    slot = 0xffffffff;
  }
  return slot;
}

Assistant:

int musicBlock::findFreeChannel(uint flag, uint channel, uchar note)
{
	uint i;

	ulong bestfit = 0;
	uint bestvoice = 0;

	for (i = 0; i < io->OPLchannels; ++i)
	{
		ulong magic;

		magic = ((channels[i].flags & CH_FREE) << 24) |
				((channels[i].note == note &&
					channels[i].channel == channel) << 30) |
				((channels[i].flags & CH_SUSTAIN) << 28) |
				((MLtime - channels[i].time) & 0x1fffffff);
		if (magic > bestfit)
		{
			bestfit = magic;
			bestvoice = i;
		}
	}
	if ((flag & 1) && !(bestfit & 0x80000000))
	{ // No free channels good enough
		return -1;
	}
	releaseChannel (bestvoice, 1);
	return bestvoice;
}